

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf2yaml.cpp
# Opt level: O2

void dumpPubSection(DWARFContext *DCtx,PubSection *Y,DWARFSection Section)

{
  size_t *Offset_00;
  DWARFObject *pDVar1;
  uint16_t uVar2;
  int iVar3;
  uint32_t uVar4;
  char *Str;
  ulong uVar5;
  undefined1 local_98 [8];
  DWARFDataExtractor PubSectionData;
  DWARFSection Section_local;
  undefined1 local_50 [8];
  PubEntry NewEntry;
  uint64_t Offset;
  
  pDVar1 = (DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  PubSectionData.Section = (DWARFSection *)Section.Data.Data;
  Section_local.Data.Data = (char *)Section.Data.Length;
  iVar3 = (*pDVar1->_vptr_DWARFObject[5])(pDVar1);
  PubSectionData.super_DataExtractor.Data.Length._0_1_ = (undefined1)iVar3;
  PubSectionData.super_DataExtractor.Data.Length._1_1_ = 0;
  PubSectionData.Obj = (DWARFObject *)&PubSectionData.Section;
  Offset_00 = &NewEntry.Name.Length;
  NewEntry.Name.Length = 0;
  local_98 = (undefined1  [8])Section.Data.Data;
  PubSectionData.super_DataExtractor.Data.Data = (char *)Section.Data.Length;
  PubSectionData.super_DataExtractor._16_8_ = pDVar1;
  dumpInitialLength((DataExtractor *)local_98,Offset_00,&Y->Length);
  uVar2 = llvm::DataExtractor::getU16((DataExtractor *)local_98,Offset_00,(Error *)0x0);
  Y->Version = uVar2;
  uVar4 = llvm::DataExtractor::getU32((DataExtractor *)local_98,Offset_00,(Error *)0x0);
  Y->UnitOffset = uVar4;
  uVar4 = llvm::DataExtractor::getU32((DataExtractor *)local_98,Offset_00,(Error *)0x0);
  Y->UnitSize = uVar4;
  while( true ) {
    uVar5 = (ulong)(Y->Length).TotalLength;
    if (uVar5 == 0xffffffff) {
      uVar5 = (Y->Length).TotalLength64;
    }
    if (uVar5 <= NewEntry.Name.Length) break;
    NewEntry.DieOffset.value = 0;
    NewEntry.Descriptor.value = '\0';
    NewEntry._5_3_ = 0;
    NewEntry.Name.Data = (char *)0x0;
    local_50._0_4_ = llvm::DataExtractor::getU32((DataExtractor *)local_98,Offset_00,(Error *)0x0);
    if (Y->IsGNUStyle == true) {
      local_50[4] = llvm::DataExtractor::getU8((DataExtractor *)local_98,Offset_00,(Error *)0x0);
    }
    Str = llvm::DataExtractor::getCStr((DataExtractor *)local_98,Offset_00);
    llvm::StringRef::StringRef((StringRef *)&Section_local.Data.Length,Str);
    NewEntry.DieOffset.value = (undefined4)Section_local.Data.Length;
    NewEntry.Descriptor.value = Section_local.Data.Length._4_1_;
    NewEntry._5_3_ = Section_local.Data.Length._5_3_;
    std::vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>::push_back
              (&Y->Entries,(value_type *)local_50);
  }
  return;
}

Assistant:

void dumpPubSection(DWARFContext &DCtx, DWARFYAML::PubSection &Y,
                    DWARFSection Section) {
  DWARFDataExtractor PubSectionData(DCtx.getDWARFObj(), Section,
                                    DCtx.isLittleEndian(), 0);
  uint64_t Offset = 0;
  dumpInitialLength(PubSectionData, Offset, Y.Length);
  Y.Version = PubSectionData.getU16(&Offset);
  Y.UnitOffset = PubSectionData.getU32(&Offset);
  Y.UnitSize = PubSectionData.getU32(&Offset);
  while (Offset < Y.Length.getLength()) {
    DWARFYAML::PubEntry NewEntry;
    NewEntry.DieOffset = PubSectionData.getU32(&Offset);
    if (Y.IsGNUStyle)
      NewEntry.Descriptor = PubSectionData.getU8(&Offset);
    NewEntry.Name = PubSectionData.getCStr(&Offset);
    Y.Entries.push_back(NewEntry);
  }
}